

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O3

void __thiscall
GenericSectionImport_TextBadDataContent_Test::TestBody
          (GenericSectionImport_TextBadDataContent_Test *this)

{
  char *message;
  not_null<pstore::repo::section_content_*> expected_predicate_value;
  pointer *__ptr;
  error_code eVar1;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  section_content imported_content;
  not_null<pstore::repo::section_content_*> in_stack_fffffffffffffd78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_280;
  undefined1 local_278 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  long local_268 [2];
  AssertHelper local_258;
  undefined1 local_250 [8];
  undefined1 local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_240;
  undefined1 local_238 [16];
  _List_node_base *local_228;
  _List_node_base *p_Stack_220;
  _List_node_base local_218;
  __buckets_ptr local_208;
  __node_base_ptr *pp_Stack_200;
  __node_base local_1f8;
  __node_base _Stack_1f0;
  size_type local_1e8;
  size_t sStack_1e0;
  __node_base_ptr local_1d8;
  __node_base_ptr p_Stack_1d0;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  local_1c8;
  not_null<pstore::repo::section_content_*> local_1b0;
  not_null<pstore::database_*> local_1a8;
  parser<pstore::exchange::import_ns::callbacks> local_1a0;
  section_content local_f8;
  
  local_250 = (undefined1  [8])&local_1c8;
  local_1c8.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.kind = text;
  local_f8.align = '\x01';
  memset(&local_f8.data,0,0xa0);
  local_f8.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278 = (undefined1  [8])local_268;
  local_f8.data.buffer_ = local_f8.data.small_buffer_._M_elems;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"{ \"align\":8, \"data\":\"this is not ASCII85\" }","");
  local_1a8.ptr_ = &(this->super_GenericSectionImport).db_;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_1a8);
  local_238._8_8_ = local_238 + 8;
  p_Stack_220 = (_List_node_base *)0x0;
  local_238._0_8_ = (_List_node_base *)0x0;
  local_208 = (__buckets_ptr)0x0;
  local_248 = (undefined1  [8])0x0;
  pbStack_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_218._M_next = &local_218;
  pp_Stack_200 = &p_Stack_1d0;
  local_1f8._M_nxt = (_Hash_node_base *)0x1;
  _Stack_1f0._M_nxt = (_Hash_node_base *)0x0;
  local_1e8 = 0;
  sStack_1e0 = 0x3f800000;
  local_1d8 = (__node_base_ptr)0x0;
  p_Stack_1d0 = (__node_base_ptr)0x0;
  local_1b0.ptr_ = &local_f8;
  local_228 = (_List_node_base *)local_238._8_8_;
  local_218._M_prev = local_218._M_next;
  pstore::gsl::not_null<pstore::repo::section_content_*>::ensure_invariant(&local_1b0);
  expected_predicate_value.ptr_ = local_1b0.ptr_;
  (anonymous_namespace)::
  parse<(pstore::repo::section_kind)0,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
            (&local_1a0,(_anonymous_namespace_ *)local_278,(string *)local_1a8.ptr_,
             (database *)local_248,(string_mapping *)local_250,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)local_1b0.ptr_,in_stack_fffffffffffffd78);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_248);
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278,local_268[0] + 1);
  }
  local_278[0] = local_1a0.error_._M_value != 0;
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a0.error_._M_value == 0) {
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_248,(internal *)local_278,(AssertionResult *)0x1d9922,"false","true",
               (char *)expected_predicate_value.ptr_);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0x15e,(char *)local_248);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if (local_248 != (undefined1  [8])local_238) {
      operator_delete((void *)local_248,(ulong)(local_238._0_8_ + 1));
    }
    if (local_280._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._M_head_impl + 8))();
    }
    if (local_270 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_270,local_270);
    }
  }
  eVar1 = pstore::exchange::import_ns::make_error_code(bad_base64_data);
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar1._M_cat;
  local_278._0_4_ = eVar1._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_248,"parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::bad_base64_data)",
             &local_1a0.error_,(error_code *)local_278);
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_278);
    if (pbStack_240 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (pbStack_240->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0x160,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_278 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_278 + 8))();
    }
  }
  if (pbStack_240 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_240,pbStack_240);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.string_._M_dataplus._M_p != &local_1a0.string_.field_2) {
    operator_delete(local_1a0.string_._M_dataplus._M_p,
                    local_1a0.string_.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0.callbacks_.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.callbacks_.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_1a0.stack_.c);
  if (local_1a0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1a0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  if (local_f8.xfixups.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.xfixups.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.ifixups.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.ifixups.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.data.big_buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.data.big_buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector(&local_1c8);
  return;
}

Assistant:

TEST_F (GenericSectionImport, TextBadDataContent) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    // The data string does not contain valid ASCII85-encoded data.
    auto const & parser = parse<pstore::repo::section_kind::text> (
        R"({ "align":8, "data":"this is not ASCII85" })", &db_,
        pstore::exchange::import_ns::string_mapping{}, &inserter, &imported_content);
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::bad_base64_data));
}